

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

void double_conversion::ReadDiyFp(Vector<const_char> buffer,DiyFp *result,int *remaining_decimals)

{
  Vector<const_char> buffer_00;
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  uint64_t *in_RDX;
  undefined8 in_RDI;
  int exponent;
  uint64_t significand;
  int read_digits;
  DiyFp local_68;
  undefined4 local_54;
  int *in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint64_t local_30;
  int local_24;
  Vector<const_char> local_10;
  
  buffer_00.start_._4_4_ = in_stack_ffffffffffffffbc;
  buffer_00.start_._0_4_ = in_stack_ffffffffffffffb8;
  buffer_00._8_8_ = in_RDI;
  local_30 = ReadUint64(buffer_00,in_stack_ffffffffffffffb0);
  iVar1 = Vector<const_char>::length(&local_10);
  if (iVar1 == local_24) {
    DiyFp::DiyFp((DiyFp *)&stack0xffffffffffffffb0,local_30,0);
    *in_RDX = (uint64_t)in_stack_ffffffffffffffb0;
    *(int32_t *)(in_RDX + 1) = in_stack_ffffffffffffffb8;
    *in_RCX = 0;
  }
  else {
    pcVar2 = Vector<const_char>::operator[](&local_10,local_24);
    if ('4' < *pcVar2) {
      local_30 = local_30 + 1;
    }
    local_54 = 0;
    DiyFp::DiyFp(&local_68,local_30,0);
    *in_RDX = local_68.f_;
    *(int32_t *)(in_RDX + 1) = local_68.e_;
    iVar1 = Vector<const_char>::length(&local_10);
    *in_RCX = iVar1 - local_24;
  }
  return;
}

Assistant:

static void ReadDiyFp(Vector<const char> buffer,
                      DiyFp* result,
                      int* remaining_decimals) {
  int read_digits;
  uint64_t significand = ReadUint64(buffer, &read_digits);
  if (buffer.length() == read_digits) {
    *result = DiyFp(significand, 0);
    *remaining_decimals = 0;
  } else {
    // Round the significand.
    if (buffer[read_digits] >= '5') {
      significand++;
    }
    // Compute the binary exponent.
    int exponent = 0;
    *result = DiyFp(significand, exponent);
    *remaining_decimals = buffer.length() - read_digits;
  }
}